

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field.cc
# Opt level: O0

FieldGenerator *
google::protobuf::compiler::objectivec::FieldGenerator::Make
          (FieldDescriptor *field,GenerationOptions *generation_options)

{
  bool bVar1;
  ObjectiveCType OVar2;
  GenerationOptions *generation_options_local;
  FieldDescriptor *field_local;
  
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    OVar2 = GetObjectiveCType(field);
    if (OVar2 == OBJECTIVECTYPE_ENUM) {
      field_local = (FieldDescriptor *)operator_new(0x50);
      RepeatedEnumFieldGenerator::RepeatedEnumFieldGenerator
                ((RepeatedEnumFieldGenerator *)field_local,field,generation_options);
    }
    else if (OVar2 == OBJECTIVECTYPE_MESSAGE) {
      bVar1 = FieldDescriptor::is_map(field);
      if (bVar1) {
        field_local = (FieldDescriptor *)operator_new(0x58);
        MapFieldGenerator::MapFieldGenerator
                  ((MapFieldGenerator *)field_local,field,generation_options);
      }
      else {
        field_local = (FieldDescriptor *)operator_new(0x50);
        RepeatedMessageFieldGenerator::RepeatedMessageFieldGenerator
                  ((RepeatedMessageFieldGenerator *)field_local,field,generation_options);
      }
    }
    else {
      field_local = (FieldDescriptor *)operator_new(0x50);
      RepeatedPrimitiveFieldGenerator::RepeatedPrimitiveFieldGenerator
                ((RepeatedPrimitiveFieldGenerator *)field_local,field,generation_options);
    }
  }
  else {
    OVar2 = GetObjectiveCType(field);
    if (OVar2 == OBJECTIVECTYPE_ENUM) {
      field_local = (FieldDescriptor *)operator_new(0x50);
      EnumFieldGenerator::EnumFieldGenerator
                ((EnumFieldGenerator *)field_local,field,generation_options);
    }
    else if (OVar2 == OBJECTIVECTYPE_MESSAGE) {
      field_local = (FieldDescriptor *)operator_new(0x50);
      MessageFieldGenerator::MessageFieldGenerator
                ((MessageFieldGenerator *)field_local,field,generation_options);
    }
    else {
      bVar1 = IsReferenceType(field);
      if (bVar1) {
        field_local = (FieldDescriptor *)operator_new(0x50);
        PrimitiveObjFieldGenerator::PrimitiveObjFieldGenerator
                  ((PrimitiveObjFieldGenerator *)field_local,field,generation_options);
      }
      else {
        field_local = (FieldDescriptor *)operator_new(0x50);
        PrimitiveFieldGenerator::PrimitiveFieldGenerator
                  ((PrimitiveFieldGenerator *)field_local,field,generation_options);
      }
    }
  }
  return (FieldGenerator *)field_local;
}

Assistant:

FieldGenerator* FieldGenerator::Make(
    const FieldDescriptor* field, const GenerationOptions& generation_options) {
  if (field->is_repeated()) {
    switch (GetObjectiveCType(field)) {
      case OBJECTIVECTYPE_MESSAGE: {
        if (field->is_map()) {
          return new MapFieldGenerator(field, generation_options);
        } else {
          return new RepeatedMessageFieldGenerator(field, generation_options);
        }
      }
      case OBJECTIVECTYPE_ENUM:
        return new RepeatedEnumFieldGenerator(field, generation_options);
      default:
        return new RepeatedPrimitiveFieldGenerator(field, generation_options);
    }
  }

  switch (GetObjectiveCType(field)) {
    case OBJECTIVECTYPE_MESSAGE: {
      return new MessageFieldGenerator(field, generation_options);
    }
    case OBJECTIVECTYPE_ENUM:
      return new EnumFieldGenerator(field, generation_options);
    default:
      if (IsReferenceType(field)) {
        return new PrimitiveObjFieldGenerator(field, generation_options);
      } else {
        return new PrimitiveFieldGenerator(field, generation_options);
      }
  }
}